

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.c
# Opt level: O2

int put_pitch(int p)

{
  size_t sVar1;
  char result [8];
  
  sprintf(result,"%s%d",
          put_pitch_ptos_rel + *(int *)(put_pitch_ptos_rel + ((ulong)(uint)p % 0xc) * 4),
          (ulong)((uint)p / 0xc - 1));
  puts(result);
  sVar1 = strlen(result);
  return (int)sVar1;
}

Assistant:

private int put_pitch(int p)
{
    char result[8];
    static char *ptos[] = {
        "c", "cs", "d", "ef", "e", "f", "fs", "g",
        "gs", "a", "bf", "b"    };
    /* note octave correction below */
    sprintf(result, "%s%d", ptos[p % 12], (p / 12) - 1);
    printf("%s\n", result);
    return (int)strlen(result);
}